

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_OneofWithNoFields_Test::
~ValidationErrorTest_OneofWithNoFields_Test(ValidationErrorTest_OneofWithNoFields_Test *this)

{
  ValidationErrorTest_OneofWithNoFields_Test *this_local;
  
  ~ValidationErrorTest_OneofWithNoFields_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, OneofWithNoFields) {
  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "message_type {"
      "  name: \"Foo\""
      "  oneof_decl { name:\"bar\" }"
      "}",

      "foo.proto: Foo.bar: NAME: Oneof must have at least one field.\n");
}